

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O2

void __thiscall
slang::ast::SequenceRepetition::serializeTo(SequenceRepetition *this,ASTSerializer *serializer)

{
  Kind KVar1;
  size_t sStack_20;
  
  ASTSerializer::startObject(serializer);
  KVar1 = this->kind;
  if (KVar1 == GoTo) {
    sStack_20 = 4;
  }
  else if (KVar1 == Nonconsecutive) {
    sStack_20 = 0xe;
  }
  else {
    if (KVar1 != Consecutive) goto LAB_003ae261;
    sStack_20 = 0xb;
  }
  ASTSerializer::write(serializer,4,"kind",sStack_20);
LAB_003ae261:
  SequenceRange::serializeTo(&this->range,serializer);
  ASTSerializer::endObject(serializer);
  return;
}

Assistant:

void SequenceRepetition::serializeTo(ASTSerializer& serializer) const {
    serializer.startObject();

    switch (kind) {
        case Consecutive:
            serializer.write("kind", "Consecutive"sv);
            break;
        case Nonconsecutive:
            serializer.write("kind", "Nonconsecutive"sv);
            break;
        case GoTo:
            serializer.write("kind", "GoTo"sv);
            break;
    }

    range.serializeTo(serializer);
    serializer.endObject();
}